

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

bool ImgfsFile::isimgfsheader(ReadWriter_ptr *rd,uint64_t ofs)

{
  element_type *peVar1;
  bool bVar2;
  allocator_type local_39;
  uint8_t imgfsuuid [16];
  ByteVector sig;
  
  imgfsuuid[0] = 0xf8;
  imgfsuuid[1] = 0xac;
  imgfsuuid[2] = ',';
  imgfsuuid[3] = 0x9d;
  imgfsuuid[4] = 0xe3;
  imgfsuuid[5] = 0xd4;
  imgfsuuid[6] = '+';
  imgfsuuid[7] = 'M';
  imgfsuuid[8] = 0xbd;
  imgfsuuid[9] = '0';
  imgfsuuid[10] = 0x91;
  imgfsuuid[0xb] = 'n';
  imgfsuuid[0xc] = 0xd8;
  imgfsuuid[0xd] = 'O';
  imgfsuuid[0xe] = '1';
  imgfsuuid[0xf] = 0xdc;
  (*((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_ReadWriter[4])
            ();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&sig,0x10,&local_39);
  peVar1 = (rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_ReadWriter[2])
            (peVar1,sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
             (long)sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  bVar2 = std::__equal<true>::equal<unsigned_char>
                    (imgfsuuid,(uchar *)&sig,
                     sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar2;
}

Assistant:

static bool isimgfsheader(ReadWriter_ptr rd, uint64_t ofs)
    {
        const uint8_t imgfsuuid[16]= {
            0xf8, 0xac, 0x2c, 0x9d, 0xe3, 0xd4, 0x2b, 0x4d, 0xbd, 0x30, 0x91, 0x6e, 0xd8, 0x4f, 0x31, 0xdc
        };
        rd->setpos(ofs);
        ByteVector sig(16);
        rd->read(&sig[0], sig.size());

        return std::equal(imgfsuuid, imgfsuuid+sizeof(imgfsuuid), &sig[0]);
    }